

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O1

void __thiscall primesieve::iterator::skipto(iterator *this,uint64_t start,uint64_t stop_hint)

{
  pointer puVar1;
  
  this->start_ = start;
  this->stop_ = start;
  this->stop_hint_ = stop_hint;
  this->dist_ = 0;
  this->i_ = 0;
  this->last_idx_ = 0;
  std::__uniq_ptr_impl<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
  ::reset((__uniq_ptr_impl<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
           *)&this->primeGenerator_,(pointer)0x0);
  puVar1 = (this->primes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->primes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->primes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void iterator::skipto(uint64_t start,
                      uint64_t stop_hint)
{
  start_ = start;
  stop_ = start;
  stop_hint_ = stop_hint;
  i_ = 0;
  last_idx_ = 0;
  dist_ = 0;
  clear(primeGenerator_);
  primes_.clear();
}